

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

void __thiscall
btCollisionWorld::debugDrawObject
          (btCollisionWorld *this,btTransform *worldTransform,btCollisionShape *shape,
          btVector3 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  void *pvVar9;
  btCollisionShape *pbVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar15;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar16;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  long lVar17;
  long lVar18;
  btBoxShape *boxShape;
  long lVar19;
  code *UNRECOVERED_JUMPTABLE;
  btConvexTriangleMeshShape *convexMesh;
  ulong uVar20;
  long lVar21;
  long lVar22;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined4 extraout_XMM0_Da_02;
  int extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined4 uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  btVector3 b;
  btConcaveShape *concaveMesh;
  btVector3 halfExtents;
  btVector3 wa;
  btVector3 wb;
  float local_168;
  undefined4 uStack_164;
  float local_158;
  float fStack_154;
  float local_148;
  float fStack_144;
  undefined1 local_138 [8];
  undefined8 uStack_130;
  undefined1 local_128 [16];
  btCollisionShape *local_118;
  btVector3 *local_110;
  long local_108;
  undefined1 local_f8 [8];
  btInternalTriangleIndexCallback bStack_f0;
  undefined8 local_e8;
  ulong local_e0;
  undefined8 uStack_d8;
  ulong local_d0;
  undefined1 auStack_c8 [16];
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  btScalar local_a0;
  btScalar bStack_9c;
  btScalar bStack_98;
  btScalar bStack_94;
  undefined1 local_88 [16];
  long local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_40 [16];
  undefined4 extraout_var_06;
  
  iVar12 = (*this->_vptr_btCollisionWorld[5])();
  if (CONCAT44(extraout_var,iVar12) != 0) {
    iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
    sVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar12) + 0x70))
                       ((long *)CONCAT44(extraout_var_00,iVar12));
    if (sVar11 < 0) {
      iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar12) + 0x80))
                (0x3f800000,(long *)CONCAT44(extraout_var_01,iVar12),worldTransform);
    }
  }
  iVar12 = shape->m_shapeType;
  switch(iVar12) {
  case 0:
    uVar7 = *(undefined8 *)&shape[1].field_0xc;
    uVar8 = *(undefined8 *)((long)&shape[1].m_userPointer + 4);
    (*shape->_vptr_btCollisionShape[0xc])(shape);
    (*shape->_vptr_btCollisionShape[0xc])(shape);
    local_128._0_4_ = extraout_XMM0_Da_00;
    (*shape->_vptr_btCollisionShape[0xc])(shape);
    local_158 = (float)uVar7;
    fStack_154 = (float)((ulong)uVar7 >> 0x20);
    local_168 = (float)uVar8;
    uStack_164 = (undefined4)((ulong)uVar8 >> 0x20);
    local_f8._4_4_ = (float)local_128._0_4_ + fStack_154;
    local_f8._0_4_ = extraout_XMM0_Da + local_158;
    bStack_f0._vptr_btInternalTriangleIndexCallback._0_4_ = local_168 + extraout_XMM0_Da_01;
    bStack_f0._vptr_btInternalTriangleIndexCallback._4_4_ = uStack_164;
    iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
    uStack_130._0_4_ =
         (float)((uint)bStack_f0._vptr_btInternalTriangleIndexCallback._0_4_ ^ 0x80000000);
    local_138 = (undefined1  [8])((ulong)local_f8 ^ 0x8000000080000000);
    unique0x100005d9 = 0;
    (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar12) + 0xa0))
              ((long *)CONCAT44(extraout_var_02,iVar12),local_138,local_f8,worldTransform,color);
    return;
  case 8:
    (*shape->_vptr_btCollisionShape[0xc])(shape);
    iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_07,iVar12) + 0x30);
    (*UNRECOVERED_JUMPTABLE)
              (extraout_XMM0_Da_02,(long *)CONCAT44(extraout_var_07,iVar12),worldTransform,color,
               UNRECOVERED_JUMPTABLE);
    return;
  case 9:
    lVar21 = (long)*(int *)&shape[3].field_0xc;
    if (lVar21 < 1) {
      return;
    }
    lVar22 = lVar21 + 1;
    lVar21 = lVar21 << 4;
    local_110 = color;
    do {
      lVar19 = *(long *)&shape[3].m_userIndex;
      fVar23 = *(float *)(lVar19 + -0x10 + lVar21);
      fVar30 = *(float *)(lVar19 + -0xc + lVar21);
      fVar27 = *(float *)(lVar19 + -8 + lVar21);
      iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
      fVar28 = (worldTransform->m_basis).m_el[0].m_floats[0];
      fVar1 = (worldTransform->m_basis).m_el[0].m_floats[1];
      fVar2 = (worldTransform->m_basis).m_el[1].m_floats[0];
      fVar3 = (worldTransform->m_basis).m_el[1].m_floats[1];
      fVar4 = (worldTransform->m_basis).m_el[2].m_floats[0];
      fVar5 = (worldTransform->m_basis).m_el[2].m_floats[1];
      fVar6 = (worldTransform->m_basis).m_el[2].m_floats[2];
      fVar38 = (worldTransform->m_basis).m_el[0].m_floats[2];
      fVar24 = (worldTransform->m_basis).m_el[1].m_floats[2];
      uVar7 = *(undefined8 *)(worldTransform->m_origin).m_floats;
      local_f8._4_4_ = fVar38 * 0.0 + fVar28 * 0.0 + fVar1;
      local_f8._0_4_ = fVar38 * 0.0 + fVar28 + fVar1 * 0.0;
      bStack_f0._vptr_btInternalTriangleIndexCallback._0_4_ = fVar28 * 0.0 + fVar1 * 0.0 + fVar38;
      bStack_f0._vptr_btInternalTriangleIndexCallback._4_4_ = 0;
      local_e8 = CONCAT44(fVar24 * 0.0 + fVar2 * 0.0 + fVar3,fVar24 * 0.0 + fVar2 + fVar3 * 0.0);
      local_e0 = (ulong)(uint)(fVar2 * 0.0 + fVar3 * 0.0 + fVar24);
      uStack_d8 = CONCAT44(fVar6 * 0.0 + fVar4 * 0.0 + fVar5,fVar6 * 0.0 + fVar4 + fVar5 * 0.0);
      local_d0 = (ulong)(uint)(fVar4 * 0.0 + fVar5 * 0.0 + fVar6);
      auStack_c8._4_4_ =
           (float)((ulong)uVar7 >> 0x20) + fVar24 * fVar27 + fVar2 * fVar23 + fVar3 * fVar30;
      auStack_c8._0_4_ = (float)uVar7 + fVar38 * fVar27 + fVar28 * fVar23 + fVar1 * fVar30;
      auStack_c8._8_4_ =
           fVar27 * fVar6 + fVar5 * fVar30 + fVar23 * fVar4 + (worldTransform->m_origin).m_floats[2]
      ;
      auStack_c8._12_4_ = 0;
      (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar12) + 0x30))
                (*(undefined4 *)(*(long *)&shape[4].m_userIndex + -8 + lVar22 * 4),
                 (long *)CONCAT44(extraout_var_09,iVar12),local_f8,local_110);
      lVar22 = lVar22 + -1;
      lVar21 = lVar21 + -0x10;
    } while (1 < lVar22);
    return;
  case 10:
    iVar12 = *(int *)((long)&shape[2]._vptr_btCollisionShape + 4);
    uVar20 = (ulong)iVar12;
    iVar12 = *(int *)(&shape[1].field_0xc + (long)(((iVar12 + 2) / 3) * -3 + iVar12 + 2) * 4);
    uVar29 = *(undefined4 *)(&shape[1].field_0xc + uVar20 * 4);
    iVar13 = (*this->_vptr_btCollisionWorld[5])(this);
    plVar16 = (long *)CONCAT44(extraout_var_06,iVar13);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar16 + 0xa8);
    break;
  case 0xb:
    iVar12 = shape[2].m_shapeType;
    uVar29 = *(undefined4 *)&shape[2].field_0xc;
    uVar14 = *(uint *)((long)&shape[2].m_userPointer + 4);
    iVar13 = (*this->_vptr_btCollisionWorld[5])(this);
    plVar16 = (long *)CONCAT44(extraout_var_08,iVar13);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar16 + 0xb8);
    uVar20 = (ulong)uVar14;
    goto LAB_00144e0d;
  case 0xd:
    uVar20 = (ulong)*(int *)((long)&shape[2]._vptr_btCollisionShape + 4);
    (*shape->_vptr_btCollisionShape[0x17])(shape);
    uVar7 = *(undefined8 *)&shape[1].field_0xc;
    uVar8 = *(undefined8 *)((long)&shape[1].m_userPointer + 4);
    (*shape->_vptr_btCollisionShape[0xc])(shape);
    local_128._0_4_ = extraout_XMM0_Da_04;
    (*shape->_vptr_btCollisionShape[0xc])(shape);
    local_108._0_4_ = extraout_XMM0_Da_05;
    (*shape->_vptr_btCollisionShape[0xc])(shape);
    local_148 = (float)uVar7;
    fStack_144 = (float)((ulong)uVar7 >> 0x20);
    local_158 = (float)uVar8;
    fStack_154 = (float)((ulong)uVar8 >> 0x20);
    local_f8._4_4_ = (float)local_108 + fStack_144;
    local_f8._0_4_ = (float)local_128._0_4_ + local_148;
    bStack_f0._vptr_btInternalTriangleIndexCallback._0_4_ = local_158 + extraout_XMM0_Da_06;
    bStack_f0._vptr_btInternalTriangleIndexCallback._4_4_ = fStack_154;
    uVar29 = *(undefined4 *)(local_f8 + uVar20 * 4);
    iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
    plVar16 = (long *)CONCAT44(extraout_var_10,iVar12);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar16 + 0xb0);
    iVar12 = extraout_XMM0_Da_03;
    break;
  default:
    if (iVar12 == 0x1c) {
      uVar29 = *(undefined4 *)&shape[2].m_userPointer;
      iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_11,iVar12) + 0xc0);
      (*UNRECOVERED_JUMPTABLE)
                (uVar29,(long *)CONCAT44(extraout_var_11,iVar12),shape + 2,worldTransform,color,
                 UNRECOVERED_JUMPTABLE);
      return;
    }
    if (iVar12 == 0x1f) {
      lVar21 = (long)*(int *)((long)&shape[1]._vptr_btCollisionShape + 4);
      if (lVar21 < 1) {
        return;
      }
      lVar22 = lVar21 + 1;
      lVar21 = lVar21 * 0x58 + -0x18;
      do {
        pvVar9 = shape[1].m_userPointer;
        fVar23 = *(float *)((long)pvVar9 + lVar21 + -0x38);
        fVar30 = *(float *)((long)pvVar9 + lVar21 + -0x28);
        fVar27 = *(float *)((long)pvVar9 + lVar21 + -0x18);
        uVar7 = *(undefined8 *)((long)pvVar9 + lVar21 + -0x40);
        fVar34 = (float)uVar7;
        fVar35 = (float)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)((long)pvVar9 + lVar21 + -0x30);
        fVar36 = (float)uVar7;
        fVar37 = (float)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)((long)pvVar9 + lVar21 + -0x20);
        fVar31 = (float)uVar7;
        fVar33 = (float)((ulong)uVar7 >> 0x20);
        fVar28 = (worldTransform->m_basis).m_el[0].m_floats[0];
        fVar1 = (worldTransform->m_basis).m_el[0].m_floats[1];
        fVar2 = (worldTransform->m_basis).m_el[0].m_floats[2];
        fVar3 = (worldTransform->m_basis).m_el[1].m_floats[0];
        fVar4 = (worldTransform->m_basis).m_el[1].m_floats[1];
        fVar5 = (worldTransform->m_basis).m_el[1].m_floats[2];
        fVar32 = fVar27 * fVar5 + fVar23 * fVar3 + fVar30 * fVar4;
        local_108 = CONCAT44(local_108._4_4_,fVar32);
        fVar6 = (worldTransform->m_basis).m_el[2].m_floats[1];
        fVar38 = (worldTransform->m_basis).m_el[2].m_floats[0];
        fVar24 = (worldTransform->m_basis).m_el[2].m_floats[2];
        fVar26 = fVar27 * fVar24 + fVar23 * fVar38 + fVar30 * fVar6;
        local_128._0_4_ = fVar26;
        fVar25 = *(float *)((long)pvVar9 + lVar21 + -0xc);
        fVar39 = *(float *)((long)pvVar9 + lVar21 + -0x10);
        fVar40 = *(float *)((long)pvVar9 + lVar21 + -8);
        uVar7 = *(undefined8 *)(worldTransform->m_origin).m_floats;
        local_f8._4_4_ = fVar2 * fVar33 + fVar28 * fVar35 + fVar1 * fVar37;
        local_f8._0_4_ = fVar2 * fVar31 + fVar28 * fVar34 + fVar1 * fVar36;
        bStack_f0._vptr_btInternalTriangleIndexCallback._0_4_ =
             fVar27 * fVar2 + fVar23 * fVar28 + fVar30 * fVar1;
        local_e8 = CONCAT44(fVar5 * fVar33 + fVar3 * fVar35 + fVar4 * fVar37,
                            fVar5 * fVar31 + fVar3 * fVar34 + fVar4 * fVar36);
        bStack_f0._vptr_btInternalTriangleIndexCallback._4_4_ = 0;
        local_e0 = (ulong)(uint)fVar32;
        uStack_d8 = CONCAT44(fVar24 * fVar33 + fVar38 * fVar35 + fVar6 * fVar37,
                             fVar24 * fVar31 + fVar38 * fVar34 + fVar6 * fVar36);
        local_d0 = (ulong)(uint)fVar26;
        auStack_c8._4_4_ =
             (float)((ulong)uVar7 >> 0x20) + fVar5 * fVar40 + fVar3 * fVar39 + fVar4 * fVar25;
        auStack_c8._0_4_ = (float)uVar7 + fVar2 * fVar40 + fVar28 * fVar39 + fVar1 * fVar25;
        auStack_c8._8_4_ =
             fVar40 * fVar24 + fVar39 * fVar38 + fVar25 * fVar6 +
             (worldTransform->m_origin).m_floats[2];
        auStack_c8._12_4_ = 0;
        (*this->_vptr_btCollisionWorld[7])
                  (this,local_f8,*(undefined8 *)((long)pvVar9 + lVar21),color);
        lVar22 = lVar22 + -1;
        lVar21 = lVar21 + -0x58;
      } while (1 < lVar22);
      return;
    }
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
    local_118 = shape;
    if (iVar12 < 7) {
      lVar21 = *(long *)&shape[2].m_shapeType;
      if (lVar21 == 0) {
        iVar12 = (*shape->_vptr_btCollisionShape[0x19])();
        pbVar10 = local_118;
        if (0 < iVar12) {
          uVar14 = 0;
          do {
            (*pbVar10->_vptr_btCollisionShape[0x1a])(pbVar10,(ulong)uVar14,local_f8,local_138);
            fVar4 = (worldTransform->m_basis).m_el[0].m_floats[0];
            fVar5 = (worldTransform->m_basis).m_el[0].m_floats[1];
            fVar6 = (worldTransform->m_basis).m_el[0].m_floats[2];
            fVar23 = (worldTransform->m_basis).m_el[2].m_floats[0];
            fVar30 = (worldTransform->m_basis).m_el[2].m_floats[1];
            fVar27 = (worldTransform->m_basis).m_el[2].m_floats[2];
            fVar28 = (worldTransform->m_basis).m_el[1].m_floats[1];
            fVar1 = (worldTransform->m_basis).m_el[1].m_floats[0];
            fVar2 = (worldTransform->m_basis).m_el[1].m_floats[2];
            uVar7 = *(undefined8 *)(worldTransform->m_origin).m_floats;
            fVar38 = (float)uVar7;
            fVar24 = (float)((ulong)uVar7 >> 0x20);
            fVar3 = (worldTransform->m_origin).m_floats[2];
            local_88._4_4_ =
                 bStack_f0._vptr_btInternalTriangleIndexCallback._0_4_ * fVar2 +
                 (float)local_f8._0_4_ * fVar1 + (float)local_f8._4_4_ * fVar28 + fVar24;
            local_88._0_4_ =
                 bStack_f0._vptr_btInternalTriangleIndexCallback._0_4_ * fVar6 +
                 (float)local_f8._0_4_ * fVar4 + (float)local_f8._4_4_ * fVar5 + fVar38;
            local_88._8_4_ =
                 bStack_f0._vptr_btInternalTriangleIndexCallback._0_4_ * fVar27 +
                 (float)local_f8._0_4_ * fVar23 + (float)local_f8._4_4_ * fVar30 + fVar3;
            local_88._12_4_ = 0;
            local_40._4_4_ =
                 (float)uStack_130 * fVar2 +
                 (float)local_138._0_4_ * fVar1 + (float)local_138._4_4_ * fVar28 + fVar24;
            local_40._0_4_ =
                 (float)uStack_130 * fVar6 +
                 (float)local_138._0_4_ * fVar4 + (float)local_138._4_4_ * fVar5 + fVar38;
            local_40._8_4_ =
                 fVar27 * (float)uStack_130 +
                 fVar23 * (float)local_138._0_4_ + fVar30 * (float)local_138._4_4_ + fVar3;
            local_40._12_4_ = 0;
            iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
            (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar12) + 0x20))
                      ((long *)CONCAT44(extraout_var_12,iVar12),local_88,local_40,color);
            uVar14 = uVar14 + 1;
            iVar12 = (*pbVar10->_vptr_btCollisionShape[0x19])(pbVar10);
          } while ((int)uVar14 < iVar12);
        }
      }
      else if (0 < *(int *)(lVar21 + 0x2c)) {
        lVar22 = 0;
        local_110 = color;
        do {
          local_70 = lVar22 * 0x30;
          lVar19 = (long)*(int *)(*(long *)(lVar21 + 0x38) + 4 + local_70);
          fVar23 = 0.0;
          local_68._0_8_ = lVar19;
          local_108 = lVar22;
          if (lVar19 == 0) {
            fVar27 = 0.0;
            fVar30 = 0.0;
          }
          else {
            lVar15 = *(long *)(lVar21 + 0x38);
            fVar27 = 0.0;
            fVar30 = 0.0;
            if (0 < *(int *)(lVar15 + 4 + local_70)) {
              iVar12 = *(int *)(*(long *)(*(long *)(lVar21 + 0x38) + local_70 + 0x10) + -4 +
                               lVar19 * 4);
              lVar19 = 0;
              do {
                lVar17 = (long)*(int *)(*(long *)(lVar15 + 0x10 + lVar22 * 0x30) + lVar19 * 4);
                local_128._0_8_ = lVar17;
                lVar17 = lVar17 * 0x10;
                fVar23 = fVar23 + *(float *)(*(long *)(lVar21 + 0x18) + lVar17);
                uVar7 = *(undefined8 *)(*(long *)(lVar21 + 0x18) + 4 + lVar17);
                fVar27 = fVar27 + (float)uVar7;
                fVar30 = fVar30 + (float)((ulong)uVar7 >> 0x20);
                iVar13 = (*this->_vptr_btCollisionWorld[5])(this);
                lVar15 = *(long *)(lVar21 + 0x18);
                lVar18 = (long)iVar12 * 0x10;
                fVar28 = *(float *)(lVar15 + lVar18);
                fVar1 = *(float *)(lVar15 + 4 + lVar18);
                fVar2 = *(float *)(lVar15 + 8 + lVar18);
                fVar39 = (worldTransform->m_basis).m_el[0].m_floats[0];
                fVar40 = (worldTransform->m_basis).m_el[0].m_floats[1];
                fVar26 = (worldTransform->m_basis).m_el[0].m_floats[2];
                fVar3 = (worldTransform->m_basis).m_el[2].m_floats[0];
                fVar4 = (worldTransform->m_basis).m_el[2].m_floats[1];
                fVar5 = (worldTransform->m_basis).m_el[2].m_floats[2];
                fVar6 = (worldTransform->m_basis).m_el[1].m_floats[1];
                fVar38 = (worldTransform->m_basis).m_el[1].m_floats[0];
                fVar24 = (worldTransform->m_basis).m_el[1].m_floats[2];
                uVar7 = *(undefined8 *)(worldTransform->m_origin).m_floats;
                fVar31 = (float)uVar7;
                fVar32 = (float)((ulong)uVar7 >> 0x20);
                fVar25 = (worldTransform->m_origin).m_floats[2];
                local_f8._4_4_ = fVar2 * fVar24 + fVar28 * fVar38 + fVar1 * fVar6 + fVar32;
                local_f8._0_4_ = fVar2 * fVar26 + fVar28 * fVar39 + fVar1 * fVar40 + fVar31;
                bStack_f0._vptr_btInternalTriangleIndexCallback._0_4_ =
                     fVar2 * fVar5 + fVar28 * fVar3 + fVar1 * fVar4 + fVar25;
                bStack_f0._vptr_btInternalTriangleIndexCallback._4_4_ = 0;
                fVar28 = *(float *)(lVar15 + lVar17);
                fVar1 = *(float *)(lVar15 + 4 + lVar17);
                fVar2 = *(float *)(lVar15 + 8 + lVar17);
                local_138._4_4_ = fVar2 * fVar24 + fVar28 * fVar38 + fVar1 * fVar6 + fVar32;
                local_138._0_4_ = fVar2 * fVar26 + fVar28 * fVar39 + fVar1 * fVar40 + fVar31;
                uStack_130._0_4_ = fVar5 * fVar2 + fVar3 * fVar28 + fVar4 * fVar1 + fVar25;
                unique0x1000083d = 0;
                (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar13) + 0x20))
                          ((long *)CONCAT44(extraout_var_03,iVar13),local_f8,local_138,local_110);
                lVar19 = lVar19 + 1;
                lVar15 = *(long *)(lVar21 + 0x38);
                iVar12 = local_128._0_4_;
              } while (lVar19 < *(int *)(lVar15 + 4 + lVar22 * 0x30));
            }
          }
          iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
          uVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar12) + 0x70))
                             ((long *)CONCAT44(extraout_var_04,iVar12));
          if ((uVar14 >> 0xe & 1) != 0) {
            fVar28 = 1.0 / (float)(int)local_68._0_4_;
            local_58 = ZEXT416((uint)(fVar28 * fVar27));
            fVar30 = fVar30 * fVar28;
            local_68 = ZEXT416((uint)(fVar28 * fVar23));
            _local_f8 = ZEXT816(0x3f8000003f800000);
            lVar22 = *(long *)(lVar21 + 0x38);
            fVar24 = *(float *)(lVar22 + 0x20 + local_70) + fVar28 * fVar23;
            local_128 = ZEXT416((uint)(*(float *)(lVar22 + 0x24 + local_70) + fVar28 * fVar27));
            fVar25 = *(float *)(lVar22 + 0x28 + local_70) + fVar30;
            iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
            fVar5 = (worldTransform->m_basis).m_el[0].m_floats[0];
            fVar6 = (worldTransform->m_basis).m_el[0].m_floats[1];
            fVar38 = (worldTransform->m_basis).m_el[0].m_floats[2];
            fVar23 = (worldTransform->m_basis).m_el[2].m_floats[0];
            fVar27 = (worldTransform->m_basis).m_el[2].m_floats[1];
            fVar28 = (worldTransform->m_basis).m_el[2].m_floats[2];
            fVar1 = (worldTransform->m_basis).m_el[1].m_floats[1];
            fVar2 = (worldTransform->m_basis).m_el[1].m_floats[0];
            fVar3 = (worldTransform->m_basis).m_el[1].m_floats[2];
            uVar7 = *(undefined8 *)(worldTransform->m_origin).m_floats;
            fVar39 = (float)uVar7;
            fVar40 = (float)((ulong)uVar7 >> 0x20);
            fVar4 = (worldTransform->m_origin).m_floats[2];
            local_138._4_4_ =
                 fVar30 * fVar3 + (float)local_68._0_4_ * fVar2 + (float)local_58._0_4_ * fVar1 +
                 fVar40;
            local_138._0_4_ =
                 fVar30 * fVar38 + (float)local_68._0_4_ * fVar5 + (float)local_58._0_4_ * fVar6 +
                 fVar39;
            uStack_130._0_4_ =
                 fVar30 * fVar28 + (float)local_68._0_4_ * fVar23 + (float)local_58._0_4_ * fVar27 +
                 fVar4;
            unique0x10000a25 = 0;
            local_88._4_4_ =
                 fVar25 * fVar3 + fVar24 * fVar2 + (float)local_128._0_4_ * fVar1 + fVar40;
            local_88._0_4_ =
                 fVar25 * fVar38 + fVar24 * fVar5 + (float)local_128._0_4_ * fVar6 + fVar39;
            local_88._8_4_ =
                 fVar28 * fVar25 + fVar23 * fVar24 + fVar27 * (float)local_128._0_4_ + fVar4;
            local_88._12_4_ = 0;
            (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar12) + 0x20))
                      ((long *)CONCAT44(extraout_var_05,iVar12),local_138,local_88,local_f8);
          }
          lVar22 = local_108 + 1;
          color = local_110;
        } while (lVar22 < *(int *)(lVar21 + 0x2c));
      }
    }
    pbVar10 = local_118;
    if (local_118->m_shapeType - 0x15U < 9) {
      local_138 = (undefined1  [8])0x5d5e0b6b5d5e0b6b;
      uStack_130 = 0x5d5e0b6b;
      local_88._8_4_ = 0xdd5e0b6b;
      local_88._0_8_ = 0xdd5e0b6bdd5e0b6b;
      local_88._12_4_ = 0;
      iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
      local_e8 = CONCAT44(extraout_var_13,iVar12);
      bStack_f0._vptr_btInternalTriangleIndexCallback =
           (_func_int **)&PTR__DebugDrawcallback_00223d20;
      local_f8 = (undefined1  [8])&PTR__DebugDrawcallback_00223cf0;
      local_e0 = *(ulong *)color->m_floats;
      uStack_d8 = *(undefined8 *)(color->m_floats + 2);
      local_d0 = *(ulong *)(worldTransform->m_basis).m_el[0].m_floats;
      auStack_c8 = *(undefined1 (*) [16])((worldTransform->m_basis).m_el[0].m_floats + 2);
      uStack_b8 = *(undefined8 *)((worldTransform->m_basis).m_el[1].m_floats + 2);
      local_b0 = *(undefined8 *)(worldTransform->m_basis).m_el[2].m_floats;
      uStack_a8 = *(undefined8 *)((worldTransform->m_basis).m_el[2].m_floats + 2);
      local_a0 = (worldTransform->m_origin).m_floats[0];
      bStack_9c = (worldTransform->m_origin).m_floats[1];
      bStack_98 = (worldTransform->m_origin).m_floats[2];
      bStack_94 = (worldTransform->m_origin).m_floats[3];
      (*pbVar10->_vptr_btCollisionShape[0x10])(pbVar10,local_f8,local_88,local_138);
      btInternalTriangleIndexCallback::~btInternalTriangleIndexCallback
                ((btInternalTriangleIndexCallback *)(local_f8 + 8));
      btTriangleCallback::~btTriangleCallback((btTriangleCallback *)local_f8);
    }
    pbVar10 = local_118;
    if (local_118->m_shapeType == 3) {
      uStack_130 = 0x5d5e0b6b;
      local_138 = (undefined1  [8])0x5d5e0b6b5d5e0b6b;
      local_88._8_4_ = 0xdd5e0b6b;
      local_88._0_8_ = 0xdd5e0b6bdd5e0b6b;
      local_88._12_4_ = 0;
      iVar12 = (*this->_vptr_btCollisionWorld[5])(this);
      local_e8 = CONCAT44(extraout_var_14,iVar12);
      bStack_f0._vptr_btInternalTriangleIndexCallback =
           (_func_int **)&PTR__DebugDrawcallback_00223d20;
      local_f8 = (undefined1  [8])&PTR__DebugDrawcallback_00223cf0;
      local_e0 = *(ulong *)color->m_floats;
      uStack_d8 = *(undefined8 *)(color->m_floats + 2);
      local_d0 = *(ulong *)(worldTransform->m_basis).m_el[0].m_floats;
      auStack_c8 = *(undefined1 (*) [16])((worldTransform->m_basis).m_el[0].m_floats + 2);
      uStack_b8 = *(undefined8 *)((worldTransform->m_basis).m_el[1].m_floats + 2);
      local_b0 = *(undefined8 *)(worldTransform->m_basis).m_el[2].m_floats;
      uStack_a8 = *(undefined8 *)((worldTransform->m_basis).m_el[2].m_floats + 2);
      local_a0 = (worldTransform->m_origin).m_floats[0];
      bStack_9c = (worldTransform->m_origin).m_floats[1];
      bStack_98 = (worldTransform->m_origin).m_floats[2];
      bStack_94 = (worldTransform->m_origin).m_floats[3];
      (**(code **)(**(long **)&pbVar10[3].m_userIndex + 0x10))
                (*(long **)&pbVar10[3].m_userIndex,(btInternalTriangleIndexCallback *)(local_f8 + 8)
                 ,local_88,local_138);
      btInternalTriangleIndexCallback::~btInternalTriangleIndexCallback
                ((btInternalTriangleIndexCallback *)(local_f8 + 8));
      btTriangleCallback::~btTriangleCallback((btTriangleCallback *)local_f8);
    }
    return;
  }
  uVar20 = uVar20 & 0xffffffff;
LAB_00144e0d:
  (*UNRECOVERED_JUMPTABLE)(iVar12,uVar29,plVar16,uVar20,worldTransform,color,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void btCollisionWorld::debugDrawObject(const btTransform& worldTransform, const btCollisionShape* shape, const btVector3& color)
{
	// Draw a small simplex at the center of the object
	if (getDebugDrawer() && getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawFrames)
	{
		getDebugDrawer()->drawTransform(worldTransform,1);
	}

	if (shape->getShapeType() == COMPOUND_SHAPE_PROXYTYPE)
	{
		const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(shape);
		for (int i=compoundShape->getNumChildShapes()-1;i>=0;i--)
		{
			btTransform childTrans = compoundShape->getChildTransform(i);
			const btCollisionShape* colShape = compoundShape->getChildShape(i);
			debugDrawObject(worldTransform*childTrans,colShape,color);
		}

	} else
	{

        switch (shape->getShapeType())
        {

        case BOX_SHAPE_PROXYTYPE:
            {
                const btBoxShape* boxShape = static_cast<const btBoxShape*>(shape);
                btVector3 halfExtents = boxShape->getHalfExtentsWithMargin();
                getDebugDrawer()->drawBox(-halfExtents,halfExtents,worldTransform,color);
                break;
            }

        case SPHERE_SHAPE_PROXYTYPE:
            {
                const btSphereShape* sphereShape = static_cast<const btSphereShape*>(shape);
                btScalar radius = sphereShape->getMargin();//radius doesn't include the margin, so draw with margin

                getDebugDrawer()->drawSphere(radius, worldTransform, color);
                break;
            }
        case MULTI_SPHERE_SHAPE_PROXYTYPE:
            {
                const btMultiSphereShape* multiSphereShape = static_cast<const btMultiSphereShape*>(shape);

                btTransform childTransform;
                childTransform.setIdentity();

                for (int i = multiSphereShape->getSphereCount()-1; i>=0;i--)
                {
                    childTransform.setOrigin(multiSphereShape->getSpherePosition(i));
                    getDebugDrawer()->drawSphere(multiSphereShape->getSphereRadius(i), worldTransform*childTransform, color);
                }

                break;
            }
        case CAPSULE_SHAPE_PROXYTYPE:
            {
                const btCapsuleShape* capsuleShape = static_cast<const btCapsuleShape*>(shape);

                btScalar radius = capsuleShape->getRadius();
                btScalar halfHeight = capsuleShape->getHalfHeight();

                int upAxis = capsuleShape->getUpAxis();
                getDebugDrawer()->drawCapsule(radius, halfHeight, upAxis, worldTransform, color);
                break;
            }
        case CONE_SHAPE_PROXYTYPE:
            {
                const btConeShape* coneShape = static_cast<const btConeShape*>(shape);
                btScalar radius = coneShape->getRadius();//+coneShape->getMargin();
                btScalar height = coneShape->getHeight();//+coneShape->getMargin();

                int upAxis= coneShape->getConeUpIndex();
                getDebugDrawer()->drawCone(radius, height, upAxis, worldTransform, color);
                break;

            }
        case CYLINDER_SHAPE_PROXYTYPE:
            {
                const btCylinderShape* cylinder = static_cast<const btCylinderShape*>(shape);
                int upAxis = cylinder->getUpAxis();
                btScalar radius = cylinder->getRadius();
                btScalar halfHeight = cylinder->getHalfExtentsWithMargin()[upAxis];
                getDebugDrawer()->drawCylinder(radius, halfHeight, upAxis, worldTransform, color);
                break;
            }

        case STATIC_PLANE_PROXYTYPE:
            {
                const btStaticPlaneShape* staticPlaneShape = static_cast<const btStaticPlaneShape*>(shape);
                btScalar planeConst = staticPlaneShape->getPlaneConstant();
                const btVector3& planeNormal = staticPlaneShape->getPlaneNormal();
                getDebugDrawer()->drawPlane(planeNormal, planeConst,worldTransform, color);
                break;

            }
        default:
            {

                /// for polyhedral shapes
                if (shape->isPolyhedral())
                {
                    btPolyhedralConvexShape* polyshape = (btPolyhedralConvexShape*) shape;
                    
                    int i;
                    if (polyshape->getConvexPolyhedron())
                    {
                        const btConvexPolyhedron* poly = polyshape->getConvexPolyhedron();
                        for (i=0;i<poly->m_faces.size();i++)
                        {
                            btVector3 centroid(0,0,0);
                            int numVerts = poly->m_faces[i].m_indices.size();
                            if (numVerts)
                            {
                                int lastV = poly->m_faces[i].m_indices[numVerts-1];
                                for (int v=0;v<poly->m_faces[i].m_indices.size();v++)
                                {
                                    int curVert = poly->m_faces[i].m_indices[v];
                                    centroid+=poly->m_vertices[curVert];
                                    getDebugDrawer()->drawLine(worldTransform*poly->m_vertices[lastV],worldTransform*poly->m_vertices[curVert],color);
                                    lastV = curVert;
                                }
                            }
                            centroid*= btScalar(1.f)/btScalar(numVerts);
                            if (getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawNormals)
                            {
                                btVector3 normalColor(1,1,0);
                                btVector3 faceNormal(poly->m_faces[i].m_plane[0],poly->m_faces[i].m_plane[1],poly->m_faces[i].m_plane[2]);
                                getDebugDrawer()->drawLine(worldTransform*centroid,worldTransform*(centroid+faceNormal),normalColor);
                            }
                            
                        }
                        
                        
                    } else
                    {
                        for (i=0;i<polyshape->getNumEdges();i++)
                        {
                            btVector3 a,b;
                            polyshape->getEdge(i,a,b);
                            btVector3 wa = worldTransform * a;
                            btVector3 wb = worldTransform * b;
                            getDebugDrawer()->drawLine(wa,wb,color);
                        }
                    }
                    
                    
                }
                    
                if (shape->isConcave())
                {
                    btConcaveShape* concaveMesh = (btConcaveShape*) shape;

                    ///@todo pass camera, for some culling? no -> we are not a graphics lib
                    btVector3 aabbMax(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
                    btVector3 aabbMin(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));

                    DebugDrawcallback drawCallback(getDebugDrawer(),worldTransform,color);
                    concaveMesh->processAllTriangles(&drawCallback,aabbMin,aabbMax);

                }

                if (shape->getShapeType() == CONVEX_TRIANGLEMESH_SHAPE_PROXYTYPE)
                {
                    btConvexTriangleMeshShape* convexMesh = (btConvexTriangleMeshShape*) shape;
                    //todo: pass camera for some culling			
                    btVector3 aabbMax(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
                    btVector3 aabbMin(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));
                    //DebugDrawcallback drawCallback;
                    DebugDrawcallback drawCallback(getDebugDrawer(),worldTransform,color);
                    convexMesh->getMeshInterface()->InternalProcessAllTriangles(&drawCallback,aabbMin,aabbMax);
                }


                
            }
       
		}
	}
}